

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

char * CVmRun::get_exc_message(vm_obj_id_t exc_obj,size_t *msg_len)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined4 extraout_var;
  long *in_RSI;
  uint in_EDI;
  uint argc;
  char *str;
  vm_obj_id_t src_obj;
  vm_val_t val;
  undefined4 local_3c [2];
  pool_ofs_t ofs;
  CVmPoolInMem *in_stack_ffffffffffffffd0;
  int local_28 [4];
  long *local_18;
  uint local_c;
  
  ofs = (pool_ofs_t)((ulong)stack0xffffffffffffffc8 >> 0x20);
  if ((in_EDI != 0) && (local_3c[0] = 0, G_predef_X.rterrmsg_prop != 0)) {
    local_18 = in_RSI;
    local_c = in_EDI;
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[0xd])
                      (pCVar2,(ulong)G_predef_X.rterrmsg_prop,local_28,(ulong)local_c,
                       &stack0xffffffffffffffd4,local_3c);
    if (iVar1 != 0) {
      if (local_28[0] == 5) {
        pCVar2 = vm_objp(0);
        iVar1 = (*pCVar2->_vptr_CVmObject[0x35])();
        register0x00000000 = (char *)CONCAT44(extraout_var,iVar1);
      }
      else if (local_28[0] == 8) {
        register0x00000000 = CVmPoolInMem::get_ptr(in_stack_ffffffffffffffd0,ofs);
      }
      else {
        stack0xffffffffffffffc8 = (char *)0x0;
      }
      if (stack0xffffffffffffffc8 != (char *)0x0) {
        iVar1 = ::osrp2(stack0xffffffffffffffc8);
        *local_18 = (long)iVar1;
        register0x00000000 = stack0xffffffffffffffc8 + 2;
      }
      return stack0xffffffffffffffc8;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *CVmRun::get_exc_message(VMG_ vm_obj_id_t exc_obj, size_t *msg_len)
{
    vm_val_t val;
    vm_obj_id_t src_obj;
    const char *str;
    uint argc;
    
    /* if there's no object, there's no message */
    if (exc_obj == VM_INVALID_OBJ)
        return 0;
    
    /* 
     *   get the exceptionMessage property value from the object; if
     *   there's not a valid exceptionMessage property defined, or the
     *   object doesn't have a value for the property, there's no message 
     */
    argc = 0;
    if (G_predef->rterrmsg_prop == VM_INVALID_PROP
        || (!vm_objp(vmg_ exc_obj)->get_prop(vmg_ G_predef->rterrmsg_prop,
                                             &val, exc_obj, &src_obj,
                                             &argc)))
        return 0;

    /* 
     *   We got the property.  If it's a string or an object containing a
     *   string, retrieve the string.
     */
    switch(val.typ)
    {
    case VM_SSTRING:
        /* get the constant string */
        str = G_const_pool->get_ptr(val.val.ofs);
        break;

    case VM_OBJ:
        /* get the string value of the object, if possible */
        str = vm_objp(vmg_ val.val.obj)->get_as_string(vmg0_);
        break;

    default:
        /* it's not a string - we can't use it */
        str = 0;
        break;
    }

    /* check to see if we got a string */
    if (str != 0)
    {
        /* 
         *   The string is in the standard VM internal format, which means
         *   it has a 2-byte length prefix followed by the bytes of the
         *   string (with no null termination).  Read the length prefix,
         *   then skip past it so the caller doesn't have to.  
         */
        *msg_len = osrp2(str);
        str += VMB_LEN;
    }

    /* return the string pointer */
    return str;
}